

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

State * __thiscall duckdb_re2::DFA::CachedState(DFA *this,int *inst,int ninst,uint32_t flag)

{
  ulong uVar1;
  StateSet *this_00;
  iterator iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  __hashtable *__h;
  State *s;
  __node_gen_type __node_gen;
  State state;
  State *local_68;
  size_t local_60;
  long local_58;
  _Hashtable<duckdb_re2::DFA::State_*,_duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>,_std::__detail::_Identity,_duckdb_re2::DFA::StateEqual,_duckdb_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_50;
  int *local_48;
  int local_40;
  uint32_t local_3c;
  
  local_50 = (_Hashtable<duckdb_re2::DFA::State_*,_duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>,_std::__detail::_Identity,_duckdb_re2::DFA::StateEqual,_duckdb_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&local_48;
  this_00 = &this->state_cache_;
  local_48 = inst;
  local_40 = ninst;
  local_3c = flag;
  iVar2 = std::
          _Hashtable<duckdb_re2::DFA::State_*,_duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>,_std::__detail::_Identity,_duckdb_re2::DFA::StateEqual,_duckdb_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&this_00->_M_h,(key_type *)&local_50);
  if (iVar2.super__Node_iterator_base<duckdb_re2::DFA::State_*,_true>._M_cur == (__node_type *)0x0)
  {
    local_58 = (long)this->prog_->bytemap_range_;
    uVar1 = local_58 + 1;
    lVar4 = ((long)ninst << 0x22) + (uVar1 << 0x23);
    lVar3 = lVar4 + 0x4000000000 >> 0x20;
    if (this->mem_budget_ < lVar3) {
      this->mem_budget_ = -1;
      local_68 = (State *)0x0;
    }
    else {
      this->mem_budget_ = this->mem_budget_ - lVar3;
      uVar5 = lVar4 + 0x1800000000 >> 0x20;
      if ((long)uVar5 < 0) {
        std::__throw_bad_alloc();
      }
      local_60 = (long)ninst << 2;
      local_68 = (State *)operator_new(uVar5);
      local_68->next_ = (atomic<duckdb_re2::DFA::State_*> *)(local_68 + 1);
      if (-1 < (int)local_58) {
        uVar5 = 0;
        do {
          local_68->next_[uVar5]._M_b._M_p = (__pointer_type)0x0;
          uVar5 = uVar5 + 1;
        } while ((uVar1 & 0xffffffff) != uVar5);
      }
      local_68->inst_ = (int *)(local_68->next_ + uVar1);
      memmove(local_68->inst_,inst,local_60);
      local_68->ninst_ = ninst;
      local_68->flag_ = flag;
      local_50 = &this_00->_M_h;
      std::
      _Hashtable<duckdb_re2::DFA::State*,duckdb_re2::DFA::State*,std::allocator<duckdb_re2::DFA::State*>,std::__detail::_Identity,duckdb_re2::DFA::StateEqual,duckdb_re2::DFA::StateHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb_re2::DFA::State*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb_re2::DFA::State*,true>>>>
                ((_Hashtable<duckdb_re2::DFA::State*,duckdb_re2::DFA::State*,std::allocator<duckdb_re2::DFA::State*>,std::__detail::_Identity,duckdb_re2::DFA::StateEqual,duckdb_re2::DFA::StateHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this_00,&local_68);
    }
  }
  else {
    local_68 = *(State **)
                ((long)iVar2.super__Node_iterator_base<duckdb_re2::DFA::State_*,_true>._M_cur + 8);
  }
  return local_68;
}

Assistant:

DFA::State* DFA::CachedState(int* inst, int ninst, uint32_t flag) {
  //mutex_.AssertHeld();

  // Look in the cache for a pre-existing state.
  // We have to initialise the struct like this because otherwise
  // MSVC will complain about the flexible array member. :(
  State state;
  state.inst_ = inst;
  state.ninst_ = ninst;
  state.flag_ = flag;
  StateSet::iterator it = state_cache_.find(&state);
  if (it != state_cache_.end()) {
    return *it;
  }

  // Must have enough memory for new state.
  // In addition to what we're going to allocate,
  // the state cache hash table seems to incur about 40 bytes per
  // State*, empirically.
  const int kStateCacheOverhead = 40;
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int mem = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
            ninst*sizeof(int);
  if (mem_budget_ < mem + kStateCacheOverhead) {
    mem_budget_ = -1;
    return NULL;
  }
  mem_budget_ -= mem + kStateCacheOverhead;

  // Allocate new state along with room for next_ and inst_.
  char* space = std::allocator<char>().allocate(mem);
  State* s = new (space) State;
  s->next_ =  new (space + sizeof(State)) std::atomic<State*>[nnext];
  // Work around a unfortunate bug in older versions of libstdc++.
  // (https://gcc.gnu.org/bugzilla/show_bug.cgi?id=64658)
  for (int i = 0; i < nnext; i++)
    (void) new (s->next_ + i) std::atomic<State*>(NULL);
  s->inst_ = new (s->next_ + nnext) int[ninst];
  memmove(s->inst_, inst, ninst*sizeof s->inst_[0]);
  s->ninst_ = ninst;
  s->flag_ = flag;
  // Put state in cache and return it.
  state_cache_.insert(s);
  return s;
}